

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

bool QGenericUnixTheme::isDBusGlobalMenuAvailable(void)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  QDBusConnection connection;
  undefined1 *local_68;
  QDBusError local_60;
  undefined1 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable == '\0') {
    iVar1 = __cxa_guard_acquire(&isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable);
    if (iVar1 != 0) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      QDBusConnection::sessionBus();
      if (checkDBusGlobalMenuAvailable()::registrarService == '\0') {
        iVar1 = __cxa_guard_acquire(&checkDBusGlobalMenuAvailable()::registrarService);
        if (iVar1 != 0) {
          checkDBusGlobalMenuAvailable()::registrarService._0_8_ = 0;
          local_60.code = NoError;
          local_60._4_4_ = 0;
          local_60.msg.d.d = (Data *)0x0;
          checkDBusGlobalMenuAvailable()::registrarService._8_8_ = anon_var_dwarf_20d3add;
          local_60.msg.d.ptr = (char16_t *)0x0;
          checkDBusGlobalMenuAvailable()::registrarService._16_8_ = 0x1f;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
          __cxa_atexit(QString::~QString,checkDBusGlobalMenuAvailable()::registrarService,
                       &__dso_handle);
          __cxa_guard_release(&checkDBusGlobalMenuAvailable()::registrarService);
        }
      }
      lVar2 = QDBusConnection::interface();
      if (lVar2 == 0) {
        local_20 = 0;
      }
      else {
        QDBusConnectionInterface::isServiceRegistered((QString *)&local_60);
        QDBusError::~QDBusError(&local_60);
      }
      QDBusConnection::~QDBusConnection((QDBusConnection *)&local_68);
      isDBusGlobalMenuAvailable::dbusGlobalMenuAvailable = (bool)local_20;
      __cxa_guard_release(&isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return isDBusGlobalMenuAvailable::dbusGlobalMenuAvailable;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericUnixTheme::isDBusGlobalMenuAvailable()
{
    static bool dbusGlobalMenuAvailable = checkDBusGlobalMenuAvailable();
    return dbusGlobalMenuAvailable;
}